

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matsubx.c
# Opt level: O2

MATRIX mat_submat(MATRIX A,int i,int j)

{
  MATRIX ppdVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  ppdVar1 = mat_creat(*(int *)(A + -1) + -1,*(int *)((long)A + -4) + -1,-1);
  uVar3 = 0;
  uVar2 = (ulong)*(uint *)(A + -1);
  if ((int)*(uint *)(A + -1) < 1) {
    uVar2 = uVar3;
  }
  iVar4 = 0;
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    if (uVar3 != (uint)i) {
      uVar6 = 0;
      uVar5 = (ulong)*(uint *)((long)A + -4);
      if ((int)*(uint *)((long)A + -4) < 1) {
        uVar5 = uVar6;
      }
      iVar7 = 0;
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        if ((uint)j != uVar6) {
          ppdVar1[iVar4][iVar7] = A[uVar3][uVar6];
          iVar7 = iVar7 + 1;
        }
      }
      iVar4 = iVar4 + 1;
    }
  }
  return ppdVar1;
}

Assistant:

MATRIX mat_submat( MATRIX A, int i, int j )
{
	int	m, m1, p, p1;
	MATRIX	S;

	S = mat_creat(MatRow(A)-1, MatCol(A)-1, UNDEFINED);

	for (m=m1=0; m<MatRow(A); m++)
		{
		if (m==i) continue;
		for (p=p1=0; p<MatCol(A); p++)
			{
			if (p==j) continue;
			S[m1][p1] = A[m][p];
			p1++;
			}
		m1++;
		}

	return (S);
}